

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSamplerCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerCreateInfo>
          (Impl *this,VkSamplerCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkSamplerCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSamplerCreateInfo>(alloc,count);
    if (pVVar1 != (VkSamplerCreateInfo *)0x0) {
      pVVar1 = (VkSamplerCreateInfo *)memmove(pVVar1,src,count * 0x50);
      return pVVar1;
    }
  }
  return (VkSamplerCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}